

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

bool P_IsVisible(AActor *lookee,AActor *other,INTBOOL allaround,FLookExParams *params)

{
  bool bVar1;
  double local_70;
  TAngle<double> local_68;
  undefined1 local_60 [16];
  DAngle an;
  double dist;
  DAngle fov;
  double mindist;
  double maxdist;
  FLookExParams *params_local;
  INTBOOL allaround_local;
  AActor *other_local;
  AActor *lookee_local;
  
  TAngle<double>::TAngle((TAngle<double> *)&dist);
  if (other == (AActor *)0x0) {
    lookee_local._7_1_ = false;
  }
  else {
    if (params == (FLookExParams *)0x0) {
      mindist = 0.0;
      fov.Degrees = 0.0;
      local_70 = 0.0;
      if (allaround == 0) {
        local_70 = 180.0;
      }
      TAngle<double>::operator=((TAngle<double> *)&dist,local_70);
    }
    else {
      mindist = params->maxDist;
      fov.Degrees = params->minDist;
      TAngle<double>::operator=((TAngle<double> *)&dist,&params->Fov);
    }
    an.Degrees = AActor::Distance2D(lookee,other,false);
    if (((mindist == 0.0) && (!NAN(mindist))) || (an.Degrees <= mindist)) {
      if (((fov.Degrees == 0.0) && (!NAN(fov.Degrees))) || (fov.Degrees <= an.Degrees)) {
        bVar1 = TAngle<double>::operator!=((TAngle<double> *)&dist,0.0);
        if (bVar1) {
          AActor::AngleTo((AActor *)local_60,lookee,SUB81(other,0));
          absangle<double>((TAngle<double> *)(local_60 + 8),(TAngle<double> *)local_60);
          TAngle<double>::operator/(&local_68,2.0);
          bVar1 = TAngle<double>::operator>((TAngle<double> *)(local_60 + 8),&local_68);
          if ((bVar1) &&
             (((fov.Degrees != 0.0 || (NAN(fov.Degrees))) ||
              (lookee->meleerange + lookee->radius < an.Degrees)))) {
            return false;
          }
        }
        lookee_local._7_1_ = P_CheckSight(lookee,other,2);
      }
      else {
        lookee_local._7_1_ = false;
      }
    }
    else {
      lookee_local._7_1_ = false;
    }
  }
  return lookee_local._7_1_;
}

Assistant:

bool P_IsVisible(AActor *lookee, AActor *other, INTBOOL allaround, FLookExParams *params)
{
	double maxdist;
	double mindist;
	DAngle fov;

	if (other == nullptr)
	{
		return false;
	}

	if (params != NULL)
	{
		maxdist = params->maxDist;
		mindist = params->minDist;
		fov = params->Fov;
	}
	else
	{
		mindist = maxdist = 0;
		fov = allaround ? 0. : 180.;
	}

	double dist = lookee->Distance2D (other);

	if (maxdist && dist > maxdist)
		return false;			// [KS] too far

	if (mindist && dist < mindist)
		return false;			// [KS] too close

	if (fov != 0)
	{
		DAngle an = absangle(lookee->AngleTo(other), lookee->Angles.Yaw);

		if (an > (fov / 2))
		{
			// if real close, react anyway
			// [KS] but respect minimum distance rules
			if (mindist || dist > lookee->meleerange + lookee->radius)
				return false;	// outside of fov
		}
	}

	// P_CheckSight is by far the most expensive operation in here so let's do it last.
	return P_CheckSight(lookee, other, SF_SEEPASTSHOOTABLELINES);
}